

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexedBWT.h
# Opt level: O1

ulint __thiscall bwtil::IndexedBWT::rank(IndexedBWT *this,uchar c,ulint i)

{
  ulint uVar1;
  int iVar2;
  undefined7 in_register_00000031;
  
  iVar2 = (int)CONCAT71(in_register_00000031,c);
  if (iVar2 == 0) {
    if (this->terminator_position < i) {
      uVar1 = WaveletTree::recursiveRank(&this->bwt_wt,'\0',i,0,0);
      return uVar1 - 1;
    }
  }
  else if (iVar2 == 0xff) {
    return (ulong)(this->terminator_position < i);
  }
  uVar1 = WaveletTree::recursiveRank(&this->bwt_wt,c,i,0,0);
  return uVar1;
}

Assistant:

ulint rank(uchar c, ulint i){//number of characters 'c' before position i excluded

		if(c==TERMINATOR)
			return i>terminator_position;

		if(c==0 and i>terminator_position)//this because the terminator in the wavelet tree is encoded as 0
			return bwt_wt.rank(0,i)-1;

		return bwt_wt.rank(c,i);

	}